

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsImportFunction::SupportsArgCall
          (AsmJsImportFunction *this,ArgSlot argCount,AsmJsType *args,AsmJsRetType *retType)

{
  bool bVar1;
  ushort local_32;
  ArgSlot i;
  AsmJsRetType *retType_local;
  AsmJsType *args_local;
  ArgSlot argCount_local;
  AsmJsImportFunction *this_local;
  
  local_32 = 0;
  while( true ) {
    if (argCount <= local_32) {
      return true;
    }
    bVar1 = AsmJsType::isExtern(args + local_32);
    if (!bVar1) break;
    local_32 = local_32 + 1;
  }
  return false;
}

Assistant:

bool AsmJsImportFunction::SupportsArgCall(ArgSlot argCount, AsmJsType* args, AsmJsRetType& retType )
    {
        for (ArgSlot i = 0; i < argCount ; i++)
        {
            if (!args[i].isExtern())
            {
                return false;
            }
        }
        return true;
    }